

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  size_t __n;
  ushort uVar1;
  sqlite_int64 iValue;
  Fts3Expr *pExpr;
  Fts3Cursor *pFVar2;
  sqlite3_vtab *psVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  MatchinfoBuffer *extraout_RAX;
  size_t sVar11;
  MatchinfoBuffer *extraout_RAX_00;
  size_t sVar12;
  MatchinfoBuffer *pMVar13;
  undefined7 uVar16;
  Mem *pMVar14;
  char *pBuf;
  LcsIterator *pLVar15;
  u8 *z;
  LcsIterator *pLVar17;
  uint uVar18;
  long lVar19;
  LcsIterator *pIter;
  bool bVar20;
  int iVar21;
  char **ppOut;
  int iVar22;
  Fts3Cursor *pFVar23;
  int iCol;
  MatchinfoBuffer *pMVar24;
  long lVar25;
  bool bVar26;
  int rc;
  int iPhrase;
  MatchInfo sInfo;
  char *a;
  int nPhrase;
  Fts3Cursor *pCsr;
  sqlite3_int64 nToken;
  int local_fc;
  Fts3Cursor *local_f8;
  undefined8 uStack_f0;
  undefined4 local_dc;
  byte *local_d8;
  Fts3Cursor *local_d0;
  MatchInfo local_c8;
  _func_void_void_ptr *local_a0;
  size_t local_98;
  undefined8 local_90;
  sqlite3_stmt *local_88;
  Fts3Table *local_80;
  sqlite3_vtab *local_78;
  LcsIterator *local_70;
  u8 *local_68;
  sqlite3_context *local_60;
  int local_54;
  char **local_50;
  long local_48;
  Fts3Cursor *local_40;
  uint local_38 [2];
  
  iVar5 = fts3FunctionArg(pContext,"matchinfo",*apVal,&local_40);
  if (iVar5 != 0) {
    return;
  }
  if (nVal < 2) {
    pbVar10 = (byte *)0x0;
  }
  else {
    pbVar10 = (byte *)sqlite3ValueText(apVal[1],'\x01');
  }
  local_d8 = (byte *)"pcx";
  if (pbVar10 != (byte *)0x0) {
    local_d8 = pbVar10;
  }
  if (local_40->pExpr == (Fts3Expr *)0x0) {
    setResultStrOrError(pContext,"",0,'\0',(_func_void_void_ptr *)0x0);
    return;
  }
  local_78 = (local_40->base).pVtab;
  local_c8.nDoc = 0;
  local_c8.flag = '\0';
  local_c8._25_7_ = 0;
  local_c8.aMatchinfo = (u32 *)0x0;
  local_c8.pCursor = local_40;
  local_c8.nCol = *(int *)&local_78[2].pModule;
  pMVar13 = (MatchinfoBuffer *)(ulong)(uint)local_c8.nCol;
  local_c8.nPhrase = 0;
  pMVar24 = local_40->pMIBuffer;
  if (pMVar24 != (MatchinfoBuffer *)0x0) {
    uVar6 = strcmp(pMVar24->zMatchinfo,(char *)local_d8);
    pMVar13 = (MatchinfoBuffer *)(ulong)uVar6;
    if (uVar6 != 0) {
      pMVar24->aRef[0] = '\0';
      if ((pMVar24->aRef[1] == '\0') && (pMVar24->aRef[2] == '\0')) {
        sqlite3_free(pMVar24);
        pMVar13 = extraout_RAX;
      }
      local_40->pMIBuffer = (MatchinfoBuffer *)0x0;
    }
  }
  iVar8 = 0;
  iVar5 = 0;
  pFVar23 = local_40;
  local_60 = pContext;
  if (local_40->pMIBuffer == (MatchinfoBuffer *)0x0) {
    lVar19 = 0;
    local_88 = (sqlite3_stmt *)((ulong)local_88 & 0xffffffff00000000);
    local_f8 = (Fts3Cursor *)((ulong)local_f8 & 0xffffffff00000000);
    fts3ExprIterate2(local_40->pExpr,(int *)&local_f8,fts3ExprPhraseCountCb,&local_88);
    local_d0 = local_40;
    local_40->nPhrase = (uint)local_88;
    local_c8.nPhrase = (uint)local_88;
    bVar4 = *local_d8;
    bVar26 = bVar4 == 0;
    if (!bVar26) {
      bVar26 = false;
      lVar19 = 0;
      pbVar10 = local_d8;
      do {
        local_f8 = (Fts3Cursor *)0x0;
        bVar20 = true;
        uVar6 = bVar4 - 0x62;
        if (uVar6 < 0x18) {
          if ((0xc24003U >> (uVar6 & 0x1f) & 1) == 0) {
            if (uVar6 == 10) {
LAB_001db48d:
              if ((*(char *)((long)&local_78[0x12].zErrMsg + 6) == '\0') &&
                 ((0x17 < uVar6 || ((0xc00001U >> (uVar6 & 0x1f) & 1) == 0)))) goto LAB_001db4b5;
            }
            else {
              if (uVar6 != 0xc) goto LAB_001db45b;
              if (*(char *)((long)&local_78[0x12].zErrMsg + 4) == '\0') {
                uVar18 = bVar4 - 0x61;
                if (uVar18 < 0x19) {
                  if ((0x1840002U >> (uVar18 & 0x1f) & 1) != 0) goto LAB_001db3ab;
                  if (uVar18 == 0) goto LAB_001db460;
                  if (uVar18 == 0xb) goto LAB_001db48d;
                }
                goto LAB_001db4b5;
              }
            }
          }
        }
        else {
LAB_001db45b:
          if (bVar4 == 0x61) {
LAB_001db460:
            if (*(char *)((long)&local_78[0x12].zErrMsg + 4) != '\0') goto LAB_001db3ab;
            if (uVar6 < 0x18) {
              if ((0xc20001U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_001db3ab;
              if (uVar6 == 10) goto LAB_001db48d;
            }
          }
LAB_001db4b5:
          bVar20 = false;
          sqlite3Fts3ErrMsg((char **)&local_f8,"unrecognized matchinfo request: %c",
                            (ulong)(uint)(int)(char)bVar4);
        }
LAB_001db3ab:
        pFVar23 = local_f8;
        if (!bVar20) {
          local_60->isError = 1;
          sqlite3VdbeMemSetStr
                    (local_60->pOut,(char *)local_f8,-1,'\x01',
                     (_func_void_void_ptr *)0xffffffffffffffff);
          sqlite3_free(pFVar23);
          iVar8 = 0;
          iVar5 = 0;
          pMVar13 = extraout_RAX_00;
          pFVar23 = local_d0;
          goto LAB_001db5bf;
        }
        sVar11 = fts3MatchinfoSize(&local_c8,*pbVar10);
        lVar19 = lVar19 + sVar11;
        bVar4 = pbVar10[1];
        bVar26 = bVar4 == 0;
        pbVar10 = pbVar10 + 1;
      } while (!bVar26);
    }
    __n = lVar19 * 8 + 0x24;
    sVar12 = strlen((char *)local_d8);
    uVar6 = sqlite3_initialize();
    pMVar13 = (MatchinfoBuffer *)(ulong)uVar6;
    if (uVar6 == 0) {
      pMVar13 = (MatchinfoBuffer *)sqlite3Malloc(__n + sVar12 + 1);
      pMVar24 = pMVar13;
    }
    else {
      pMVar24 = (MatchinfoBuffer *)0x0;
    }
    pFVar23 = local_d0;
    if (pMVar24 == (MatchinfoBuffer *)0x0) {
      iVar5 = 7;
    }
    else {
      iVar5 = 0;
      local_98 = sVar12;
      memset(pMVar24,0,__n);
      pMVar24->aMatchinfo[0] = 0x1c;
      pMVar24->aMatchinfo[lVar19 + 1] = (int)((lVar19 << 0x20) + 0x100000000U >> 0x1e) + 0x1c;
      pMVar24->nElem = (int)lVar19;
      pMVar24->zMatchinfo = (char *)(pMVar24[1].aRef + lVar19 * 8 + 4);
      pMVar13 = (MatchinfoBuffer *)memcpy(pMVar24[1].aRef + lVar19 * 8 + 4,local_d8,local_98 + 1);
      pMVar24->aRef[0] = '\x01';
    }
    pFVar23->pMIBuffer = pMVar24;
    pFVar23->isMatchinfoNeeded = 1;
    iVar8 = 1;
LAB_001db5bf:
    if (!bVar26) goto LAB_001dbd59;
  }
  uVar16 = (undefined7)((ulong)pMVar13 >> 8);
  pbVar10 = local_d8;
  if (iVar5 == 0) {
    pMVar24 = pFVar23->pMIBuffer;
    if (pMVar24->aRef[1] == '\0') {
      pMVar24->aRef[1] = '\x01';
      z = &pMVar24->field_0x1c;
    }
    else {
      if (pMVar24->aRef[2] != '\0') {
        local_dc = (undefined4)CONCAT71(uVar16,1);
        iVar5 = pMVar24->nElem;
        iVar7 = sqlite3_initialize();
        pbVar10 = local_d8;
        if (iVar7 == 0) {
          z = (u8 *)sqlite3Malloc((long)iVar5 << 2);
        }
        else {
          z = (u8 *)0x0;
        }
        iVar5 = 0;
        if (z == (u8 *)0x0) {
          iVar5 = 7;
          z = (u8 *)0x0;
          local_a0 = (_func_void_void_ptr *)0x0;
        }
        else {
          local_a0 = sqlite3_free;
          if (pMVar24->bGlobal == 0) {
            local_dc = 0;
          }
          else {
            memcpy(z,&pMVar24->field_0x1c,(long)pMVar24->nElem << 2);
            local_dc = 0;
            iVar5 = 0;
          }
        }
        goto LAB_001db66f;
      }
      pMVar24->aRef[2] = '\x01';
      z = pMVar24[1].aRef + (long)pMVar24->nElem * 4;
    }
    local_a0 = fts3MIBufferFree;
    local_dc = 0;
    iVar5 = 0;
  }
  else {
    local_dc = (undefined4)CONCAT71(uVar16,1);
    z = (u8 *)0x0;
    local_a0 = (_func_void_void_ptr *)0x0;
  }
LAB_001db66f:
  if (iVar5 == 0) {
    local_c8.nPhrase = pFVar23->nPhrase;
    local_fc = 0;
    local_80 = (Fts3Table *)(pFVar23->base).pVtab;
    local_88 = (sqlite3_stmt *)0x0;
    bVar4 = *pbVar10;
    local_c8.aMatchinfo = (u32 *)z;
    if (bVar4 != 0) {
      lVar19 = 0;
      local_68 = z;
      do {
        local_c8.flag = bVar4;
        iVar5 = local_fc;
        local_48 = lVar19;
        if (bVar4 < 0x6c) {
          if (bVar4 != 0x61) {
            if (bVar4 == 0x62) goto LAB_001db817;
            uVar6 = local_c8.nCol;
            if (bVar4 == 99) goto joined_r0x001db803;
            goto switchD_001db6eb_caseD_6d;
          }
          if (iVar8 != 0) {
            local_fc = fts3MatchinfoSelectDoctotal
                                 (local_80,&local_88,(sqlite3_int64 *)&local_f8,(char **)&local_90);
            pFVar2 = local_f8;
            pbVar10 = local_d8;
            z = local_68;
            iVar5 = local_fc;
            if ((local_fc == 0) && (0 < local_c8.nCol)) {
              lVar19 = (long)local_f8 / 2;
              lVar25 = 0;
              do {
                iVar5 = sqlite3Fts3GetVarint(local_90,(sqlite_int64 *)local_38);
                local_90 = local_90 + iVar5;
                *(int *)((long)local_c8.aMatchinfo + lVar25 * 4) =
                     (int)((long)((ulong)local_38[0] + lVar19) / (long)pFVar2);
                lVar25 = lVar25 + 1;
                pbVar10 = local_d8;
                z = local_68;
                iVar5 = local_fc;
              } while (lVar25 < local_c8.nCol);
            }
          }
        }
        else {
          switch(bVar4) {
          case 0x6c:
            iValue = pFVar23->iPrevId;
            local_f8 = (Fts3Cursor *)0x0;
            iVar5 = fts3SqlStmt(local_80,0x15,(sqlite3_stmt **)&local_f8,(sqlite3_value **)0x0);
            pFVar2 = local_f8;
            if (iVar5 == 0) {
              sqlite3_bind_int64((sqlite3_stmt *)local_f8,1,iValue);
              iVar5 = sqlite3_step((sqlite3_stmt *)pFVar2);
              if (iVar5 == 100) {
                iVar5 = 0;
                pMVar14 = columnMem((sqlite3_stmt *)pFVar2,0);
                uVar1 = pMVar14->flags;
                columnMallocFailure((sqlite3_stmt *)pFVar2);
                if ((uVar1 & 0xf) == 0) goto LAB_001db778;
              }
              iVar5 = sqlite3_reset((sqlite3_stmt *)pFVar2);
              if (iVar5 == 0) {
                iVar5 = 0x10b;
              }
              local_f8 = (Fts3Cursor *)0x0;
            }
LAB_001db778:
            pFVar2 = local_f8;
            local_fc = iVar5;
            if (iVar5 == 0) {
              pMVar14 = columnMem((sqlite3_stmt *)local_f8,0);
              pBuf = (char *)sqlite3_value_blob(pMVar14);
              columnMallocFailure((sqlite3_stmt *)pFVar2);
              if (0 < local_c8.nCol) {
                lVar19 = 0;
                do {
                  iVar5 = sqlite3Fts3GetVarint(pBuf,(sqlite_int64 *)&local_f8);
                  pBuf = pBuf + iVar5;
                  *(uint *)((long)local_c8.aMatchinfo + lVar19 * 4) = (uint)local_f8;
                  lVar19 = lVar19 + 1;
                } while (lVar19 < local_c8.nCol);
              }
            }
            sqlite3_reset((sqlite3_stmt *)pFVar2);
            pbVar10 = local_d8;
            z = local_68;
            iVar5 = local_fc;
            break;
          case 0x6d:
          case 0x6f:
          case 0x71:
          case 0x72:
switchD_001db6eb_caseD_6d:
            pExpr = pFVar23->pExpr;
            uStack_f0 = 0;
            local_90 = (char *)((ulong)local_90._4_4_ << 0x20);
            local_f8 = pFVar23;
            local_fc = fts3ExprIterate2(pExpr,(int *)&local_90,fts3ExprLoadDoclistsCb,&local_f8);
            iVar5 = local_fc;
            if (local_fc == 0) {
              if (iVar8 == 0) {
LAB_001db8fe:
                local_f8 = (Fts3Cursor *)((ulong)local_f8 & 0xffffffff00000000);
                fts3ExprIterate2(pExpr,(int *)&local_f8,fts3ExprLocalHitsCb,&local_c8);
                iVar5 = local_fc;
              }
              else {
                iVar5 = 0;
                if ((pFVar23->pDeferred == (Fts3DeferredToken *)0x0) ||
                   (iVar5 = fts3MatchinfoSelectDoctotal
                                      (local_80,&local_88,&local_c8.nDoc,(char **)0x0), iVar5 == 0))
                {
                  local_fc = iVar5;
                  local_f8 = (Fts3Cursor *)((ulong)local_f8 & 0xffffffff00000000);
                  local_fc = fts3ExprIterate2(pExpr,(int *)&local_f8,fts3ExprGlobalHitsCb,&local_c8)
                  ;
                  sqlite3Fts3EvalTestDeferred(pFVar23,&local_fc);
                  iVar5 = local_fc;
                  if (local_fc == 0) goto LAB_001db8fe;
                }
              }
            }
            break;
          case 0x6e:
            if (iVar8 != 0) {
              local_f8 = (Fts3Cursor *)0x0;
              local_fc = fts3MatchinfoSelectDoctotal
                                   (local_80,&local_88,(sqlite3_int64 *)&local_f8,(char **)0x0);
              uVar6 = (uint)local_f8;
LAB_001db9c2:
              *local_c8.aMatchinfo = uVar6;
              iVar5 = local_fc;
            }
            break;
          case 0x70:
            uVar6 = local_c8.nPhrase;
joined_r0x001db803:
            if (iVar8 != 0) goto LAB_001db9c2;
            break;
          case 0x73:
            uStack_f0 = 0;
            local_90 = (char *)((ulong)local_90._4_4_ << 0x20);
            local_f8 = pFVar23;
            local_fc = fts3ExprIterate2(pFVar23->pExpr,(int *)&local_90,fts3ExprLoadDoclistsCb,
                                        &local_f8);
            iVar5 = local_fc;
            if (local_fc == 0) {
              iVar5 = pFVar23->nPhrase;
              local_54 = iVar8;
              iVar8 = sqlite3_initialize();
              if (iVar8 == 0) {
                pLVar15 = (LcsIterator *)sqlite3Malloc((long)iVar5 << 5);
              }
              else {
                pLVar15 = (LcsIterator *)0x0;
              }
              if (pLVar15 == (LcsIterator *)0x0) {
                z = local_68;
                iVar8 = local_54;
                iVar5 = 7;
              }
              else {
                memset(pLVar15,0,(long)pFVar23->nPhrase << 5);
                local_f8 = (Fts3Cursor *)((ulong)local_f8 & 0xffffffff00000000);
                fts3ExprIterate2(pFVar23->pExpr,(int *)&local_f8,fts3MatchinfoLcsCb,pLVar15);
                if (0 < (long)local_c8.nPhrase) {
                  lVar19 = 0;
                  iVar5 = 0;
                  do {
                    iVar5 = iVar5 - *(int *)(*(long *)(*(long *)((long)&pLVar15->pExpr + lVar19) +
                                                      0x20) + 0x50);
                    *(int *)((long)&pLVar15->iPosOffset + lVar19) = iVar5;
                    lVar19 = lVar19 + 0x20;
                  } while ((long)local_c8.nPhrase * 0x20 != lVar19);
                }
                local_d0 = pFVar23;
                local_70 = pLVar15;
                if (local_c8.nCol < 1) {
                  iVar5 = 0;
                }
                else {
                  local_50 = &pLVar15->pRead;
                  local_98 = 0;
                  iVar5 = 0;
                  do {
                    iVar8 = 0;
                    if (0 < local_c8.nPhrase) {
                      lVar19 = 0;
                      iVar8 = 0;
                      ppOut = local_50;
                      do {
                        iVar5 = sqlite3Fts3EvalPhrasePoslist
                                          (local_d0,((LcsIterator *)(ppOut + -2))->pExpr,
                                           (int)local_98,ppOut);
                        iVar7 = 0xb;
                        if (iVar5 == 0) {
                          bVar26 = true;
                          if (*ppOut != (char *)0x0) {
                            *(int *)(ppOut + 1) = *(int *)(ppOut + -1);
                            fts3LcsIteratorAdvance((LcsIterator *)(ppOut + -2));
                            if (*ppOut == (char *)0x0) {
                              iVar5 = 0x10b;
                              bVar26 = false;
                              goto LAB_001dbb9b;
                            }
                            iVar8 = iVar8 + 1;
                          }
                          iVar5 = 0;
                          iVar7 = 0;
                        }
                        else {
                          bVar26 = false;
                        }
LAB_001dbb9b:
                        if (!bVar26) goto LAB_001dbc3f;
                        lVar19 = lVar19 + 1;
                        ppOut = ppOut + 4;
                      } while (lVar19 < local_c8.nPhrase);
                    }
                    pLVar15 = local_70;
                    iVar7 = 0;
                    iVar21 = 0;
                    if (0 < iVar8) {
                      iVar21 = 0;
                      do {
                        lVar19 = (long)local_c8.nPhrase;
                        if (lVar19 < 1) {
                          pIter = (LcsIterator *)0x0;
                        }
                        else {
                          iVar9 = 0;
                          pIter = (LcsIterator *)0x0;
                          pLVar17 = pLVar15;
                          do {
                            if (pLVar17->pRead == (char *)0x0) {
                              iVar9 = 0;
                            }
                            else {
                              if ((pIter == (LcsIterator *)0x0) || (pLVar17->iPos < pIter->iPos)) {
                                pIter = pLVar17;
                              }
                              if ((iVar9 == 0) || (iVar22 = 1, pLVar17->iPos == pLVar17[-1].iPos)) {
                                iVar22 = iVar9 + 1;
                              }
                              iVar9 = iVar22;
                              if (iVar21 < iVar9) {
                                iVar21 = iVar9;
                              }
                            }
                            pLVar17 = pLVar17 + 1;
                            lVar19 = lVar19 + -1;
                          } while (lVar19 != 0);
                        }
                        iVar9 = fts3LcsIteratorAdvance(pIter);
                        iVar22 = iVar8 - iVar9;
                        bVar26 = iVar9 <= iVar8;
                        iVar8 = iVar22;
                      } while (iVar22 != 0 && bVar26);
                    }
                    *(int *)((long)local_c8.aMatchinfo + local_98 * 4) = iVar21;
LAB_001dbc3f:
                    pbVar10 = local_d8;
                    if (iVar7 != 0) {
                      pFVar23 = local_d0;
                      z = local_68;
                      iVar8 = local_54;
                      if (iVar7 != 0xb) goto LAB_001dbc9f;
                      break;
                    }
                    local_98 = local_98 + 1;
                  } while ((long)local_98 < (long)local_c8.nCol);
                }
                sqlite3_free(local_70);
                pFVar23 = local_d0;
                z = local_68;
                iVar8 = local_54;
              }
            }
            break;
          default:
            if (bVar4 != 0x79) goto switchD_001db6eb_caseD_6d;
LAB_001db817:
            sVar11 = fts3MatchinfoSize(&local_c8,bVar4);
            memset(local_c8.aMatchinfo,0,sVar11 * 4);
            iVar5 = fts3ExprLHitGather(pFVar23->pExpr,&local_c8);
          }
        }
LAB_001dbc9f:
        local_fc = iVar5;
        lVar19 = local_48;
        sVar11 = fts3MatchinfoSize(&local_c8,pbVar10[local_48]);
        local_c8.aMatchinfo = (u32 *)((long)local_c8.aMatchinfo + sVar11 * 4);
        if (local_fc != 0) break;
        bVar4 = pbVar10[lVar19 + 1];
        lVar19 = lVar19 + 1;
      } while (bVar4 != 0);
    }
    iVar5 = local_fc;
    sqlite3_reset(local_88);
    if (iVar8 != 0) {
      pMVar24 = pFVar23->pMIBuffer;
      pMVar24->bGlobal = 1;
      memcpy(pMVar24[1].aRef + (long)pMVar24->nElem * 4,&pMVar24->field_0x1c,
             (long)pMVar24->nElem << 2);
    }
  }
  if (iVar5 == 0) {
    setResultStrOrError(local_60,(char *)z,pFVar23->pMIBuffer->nElem << 2,'\0',local_a0);
  }
  else {
    sqlite3_result_error_code(local_60,iVar5);
    if ((char)local_dc == '\0') {
      (*local_a0)(z);
    }
  }
LAB_001dbd59:
  psVar3 = local_78;
  sqlite3_blob_close((sqlite3_blob *)local_78[0x13].zErrMsg);
  psVar3[0x13].zErrMsg = (char *)0x0;
  return;
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}